

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall hwnet::util::TimerMgr::Schedule(TimerMgr *this,milliseconds *now)

{
  mutex *__mutex;
  atomic_uint *paVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [8];
  pthread_t pVar5;
  bool bVar6;
  undefined1 local_40 [8];
  Ptr tmp;
  
  __mutex = &this->mtx;
  std::mutex::lock(__mutex);
  do {
    if (this->elements_size == 0) break;
    std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_40,
               &((*(this->elements).
                   super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                   _M_impl.super__Vector_impl_data._M_start)->selfPtr).
                super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
    auVar4 = local_40;
    uVar2 = *(milliseconds *)((long)local_40 + 0x30);
    uVar3 = *now;
    if (uVar2 <= uVar3) {
      pVar5 = pthread_self();
      ((id *)((long)auVar4 + 0x60))->_M_thread = pVar5;
      paVar1 = (atomic_uint *)((long)auVar4 + 0x58);
      LOCK();
      bVar6 = (paVar1->super___atomic_base<unsigned_int>)._M_i == 0;
      if (bVar6) {
        (paVar1->super___atomic_base<unsigned_int>)._M_i = 4;
      }
      UNLOCK();
      pop(this);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (bVar6) {
        Timer::operator()((Timer *)local_40);
      }
      std::mutex::lock(__mutex);
      if ((bVar6) && (*(bool *)((long)local_40 + 0x40) == false)) {
        LOCK();
        bVar6 = (((atomic_uint *)((long)local_40 + 0x58))->super___atomic_base<unsigned_int>)._M_i
                == 4;
        if (bVar6) {
          (((atomic_uint *)((long)local_40 + 0x58))->super___atomic_base<unsigned_int>)._M_i = 0;
        }
        UNLOCK();
        if (bVar6) {
          if (this->policy == 1) {
            *(milliseconds *)((long)local_40 + 0x30) =
                 *(milliseconds *)((long)local_40 + 0x38) + *now;
          }
          else {
            *(milliseconds *)((long)local_40 + 0x30) =
                 *(milliseconds *)((long)local_40 + 0x30) + *(milliseconds *)((long)local_40 + 0x38)
            ;
          }
          insert(this,(Ptr *)local_40);
          ((id *)((long)local_40 + 0x60))->_M_thread = 0;
          goto LAB_0011a99d;
        }
      }
      std::function<void_(const_std::shared_ptr<hwnet::util::Timer>_&)>::operator=
                ((Callback *)((long)local_40 + 0x10),(nullptr_t)0x0);
    }
LAB_0011a99d:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tmp);
  } while (uVar2 <= uVar3);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void TimerMgr::Schedule(const milliseconds &now) {
	this->mtx.lock();
    while (this->elements_size > 0) {
        auto tmp = top();
        if (tmp->mExpiredTime > now){
            break;
        }

       	tmp->tid = std::this_thread::get_id(); 
		uint expected = 0;
		uint setv = Timer::incallback;
		auto ok = tmp->mStatus.compare_exchange_strong(expected,setv);
        pop();

        this->mtx.unlock();
		
		if(ok) {
			(*tmp)();
		}

        this->mtx.lock();

        if(ok && !tmp->mOnce) {
        	expected = Timer::incallback;
        	setv = 0;
        	if(tmp->mStatus.compare_exchange_strong(expected,setv)) {
				if(this->policy == TimerMgr::normal) {
					tmp->mExpiredTime = now + tmp->mTimeout;
				} else {
	        		tmp->mExpiredTime += tmp->mTimeout;
	        	}
	        	this->insert(tmp);
	        	tmp->tid = std::thread::id();       
	        	continue; 		
        	}
        }
        tmp->mCallback = nullptr;
    }
    this->mtx.unlock();
}